

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

size_t SaveEXRMultipartImageToMemory
                 (EXRImage *exr_images,EXRHeader **exr_headers,uint num_parts,uchar **memory_out,
                 char **err)

{
  size_t sVar1;
  allocator local_31;
  string local_30;
  
  if ((num_parts < 2 || (exr_headers == (EXRHeader **)0x0 || exr_images == (EXRImage *)0x0)) ||
      memory_out == (uchar **)0x0) {
    std::__cxx11::string::string
              ((string *)&local_30,"Invalid argument for SaveEXRNPartImageToMemory",&local_31);
    tinyexr::SetErrorMessage(&local_30,err);
    std::__cxx11::string::~string((string *)&local_30);
    return 0;
  }
  sVar1 = tinyexr::SaveEXRNPartImageToMemory(exr_images,exr_headers,num_parts,memory_out,err);
  return sVar1;
}

Assistant:

size_t SaveEXRMultipartImageToMemory(const EXRImage* exr_images,
                                     const EXRHeader** exr_headers,
                                     unsigned int num_parts,
                                     unsigned char** memory_out, const char** err) {
  if (exr_images == NULL || exr_headers == NULL || num_parts < 2 ||
      memory_out == NULL) {
    tinyexr::SetErrorMessage("Invalid argument for SaveEXRNPartImageToMemory",
                              err);
    return 0;
  }
  return tinyexr::SaveEXRNPartImageToMemory(exr_images, exr_headers, num_parts, memory_out, err);
}